

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilTests.cpp
# Opt level: O1

void __thiscall deqp::gles2::Functional::DepthStencilCase::~DepthStencilCase(DepthStencilCase *this)

{
  QuadRenderer *this_00;
  Surface *this_01;
  TextureLevel *pTVar1;
  pointer pRVar2;
  pointer pRVar3;
  pointer pCVar4;
  pointer pDVar5;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DepthStencilCase_00794180;
  this_00 = this->m_renderer;
  if (this_00 != (QuadRenderer *)0x0) {
    deqp::gls::FragmentOpUtil::QuadRenderer::~QuadRenderer(this_00);
    operator_delete(this_00,0x20);
  }
  this_01 = this->m_refColorBuffer;
  if (this_01 != (Surface *)0x0) {
    tcu::Surface::~Surface(this_01);
    operator_delete(this_01,0x18);
  }
  pTVar1 = this->m_refDepthBuffer;
  if (pTVar1 != (TextureLevel *)0x0) {
    tcu::TextureLevel::~TextureLevel(pTVar1);
    operator_delete(pTVar1,0x28);
  }
  pTVar1 = this->m_refStencilBuffer;
  if (pTVar1 != (TextureLevel *)0x0) {
    tcu::TextureLevel::~TextureLevel(pTVar1);
    operator_delete(pTVar1,0x28);
  }
  if (this->m_refRenderer != (ReferenceQuadRenderer *)0x0) {
    operator_delete(this->m_refRenderer,0x11108);
  }
  pRVar2 = (this->m_refVisualizeCommands).
           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar2 != (pointer)0x0) {
    operator_delete(pRVar2,(long)(this->m_refVisualizeCommands).
                                 super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar2);
  }
  pRVar2 = (this->m_refBaseDepthRenders).
           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar2 != (pointer)0x0) {
    operator_delete(pRVar2,(long)(this->m_refBaseDepthRenders).
                                 super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar2);
  }
  pRVar3 = (this->m_visualizeCommands).
           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar3 != (pointer)0x0) {
    operator_delete(pRVar3,(long)(this->m_visualizeCommands).
                                 super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar3);
  }
  pRVar3 = (this->m_baseDepthRenders).
           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar3 != (pointer)0x0) {
    operator_delete(pRVar3,(long)(this->m_baseDepthRenders).
                                 super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar3);
  }
  pCVar4 = (this->m_baseClears).
           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar4 != (pointer)0x0) {
    operator_delete(pCVar4,(long)(this->m_baseClears).
                                 super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar4);
  }
  pDVar5 = (this->m_cases).
           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pDVar5 != (pointer)0x0) {
    operator_delete(pDVar5,(long)(this->m_cases).
                                 super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar5);
  }
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

DepthStencilCase::~DepthStencilCase (void)
{
	delete m_renderer;
	delete m_refColorBuffer;
	delete m_refDepthBuffer;
	delete m_refStencilBuffer;
	delete m_refRenderer;
}